

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::openWriteFile
          (Highs *this,string *filename,string *method_name,FILE **file,HighsFileType *file_type)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *pFVar4;
  HighsLogOptions *log_options_;
  undefined8 uVar5;
  undefined8 uVar6;
  long *in_RCX;
  long in_RDI;
  undefined4 *in_R8;
  char *dot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  *in_R8 = 1;
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  if (bVar1) {
    *in_RCX = _stdout;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = fopen(pcVar3,"w");
    *in_RCX = (long)pFVar4;
    if (*in_RCX == 0) {
      log_options_ = (HighsLogOptions *)(in_RDI + 0xe28);
      uVar5 = std::__cxx11::string::c_str();
      uVar6 = std::__cxx11::string::c_str();
      highsLogUser(log_options_,kError,"Cannot open writable file \"%s\" in %s\n",uVar5,uVar6);
      return kError;
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar3 = strrchr(pcVar3,0x2e);
    if ((pcVar3 != (char *)0x0) &&
       (bVar1 = std::operator!=((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar1)
       ) {
      iVar2 = strcmp(pcVar3 + 1,"mps");
      if (iVar2 == 0) {
        *in_R8 = 2;
      }
      else {
        iVar2 = strcmp(pcVar3 + 1,"lp");
        if (iVar2 == 0) {
          *in_R8 = 3;
        }
        else {
          iVar2 = strcmp(pcVar3 + 1,"md");
          if (iVar2 == 0) {
            *in_R8 = 4;
          }
        }
      }
    }
  }
  return kOk;
}

Assistant:

HighsStatus Highs::openWriteFile(const string filename,
                                 const string method_name, FILE*& file,
                                 HighsFileType& file_type) const {
  file_type = HighsFileType::kFull;
  if (filename == "") {
    // Empty file name: use stdout
    file = stdout;
  } else {
    file = fopen(filename.c_str(), "w");
    if (file == 0) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot open writable file \"%s\" in %s\n", filename.c_str(),
                   method_name.c_str());
      return HighsStatus::kError;
    }
    const char* dot = strrchr(filename.c_str(), '.');
    if (dot && dot != filename) {
      if (strcmp(dot + 1, "mps") == 0) {
        file_type = HighsFileType::kMps;
      } else if (strcmp(dot + 1, "lp") == 0) {
        file_type = HighsFileType::kLp;
      } else if (strcmp(dot + 1, "md") == 0) {
        file_type = HighsFileType::kMd;
      }
    }
  }
  return HighsStatus::kOk;
}